

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::set_uint_val(char *ext,ulong val)

{
  bool bVar1;
  int16_t tmp;
  short sVar2;
  
  ext[4] = '\0';
  sVar2 = 0;
  memset(ext + 5,0,(ulong)(*(ushort *)ext + 1 >> 1));
  if (val != 0) {
    sVar2 = 0;
    do {
      shift_right(ext,1);
      ext[5] = ext[5] & 0xfU | ((char)val + (char)(val / 10) * -10) * '\x10';
      sVar2 = sVar2 + 1;
      bVar1 = 9 < val;
      val = val / 10;
    } while (bVar1);
  }
  *(short *)(ext + 2) = sVar2;
  normalize(ext);
  return;
}

Assistant:

void CVmObjBigNum::set_uint_val(char *ext, ulong val)
{
    size_t prec;
    int exp;

    /* get the precision */
    prec = get_prec(ext);

    /* set the type to number */
    ext[VMBN_FLAGS] = 0;
    set_type(ext, VMBN_T_NUM);

    /* the value is unsigned, so it's non-negative */
    set_neg(ext, FALSE);

    /* initially zero the mantissa */
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* initialize the exponent to zero */
    exp = 0;

    /* shift the integer value into the value */
    while (val != 0)
    {
        unsigned int dig;

        /* get the low-order digit of the value */
        dig = (unsigned int)(val % 10);

        /* shift the value one place */
        val /= 10;

        /* 
         *   shift our number one place right to accommodate this next
         *   higher-order digit 
         */
        shift_right(ext, 1);

        /* set the new most significant digit */
        set_dig(ext, 0, dig);

        /* that's another factor of 10 */
        ++exp;
    }

    /* set the exponent */
    set_exp(ext, exp);

    /* normalize the number */
    normalize(ext);
}